

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void byte_swap(char *buf,int len)

{
  undefined1 uVar1;
  undefined2 uVar2;
  int in_ESI;
  undefined4 *in_RDI;
  char tmp_2;
  int2 tmp_1;
  int4 tmp;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI != 2) {
    if (in_ESI != 4) {
      if (in_ESI != 8) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                      ,0x70a,"void byte_swap(char *, int)");
      }
      in_stack_fffffffffffffff0 = *in_RDI;
      *in_RDI = in_RDI[1];
      in_RDI[1] = in_stack_fffffffffffffff0;
      byte_swap((char *)CONCAT44(8,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    }
    uVar2 = *(undefined2 *)in_RDI;
    *(undefined2 *)in_RDI = *(undefined2 *)((long)in_RDI + 2);
    *(undefined2 *)((long)in_RDI + 2) = uVar2;
    byte_swap((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              CONCAT22(uVar2,(short)in_stack_ffffffffffffffec));
  }
  uVar1 = *(undefined1 *)in_RDI;
  *(undefined1 *)in_RDI = *(undefined1 *)((long)in_RDI + 1);
  *(undefined1 *)((long)in_RDI + 1) = uVar1;
  return;
}

Assistant:

static void
byte_swap(char *buf, int len)
{
    switch(len) {
    case 8: {
	int4 tmp;
	tmp = ((int4*) buf)[0];
	((int4*)buf)[0] = ((int4*) buf)[1];
	((int4*) buf)[1] = tmp;
	byte_swap(buf + 4, 4);
	/* falling through */
    }
    case 4: {
	int2 tmp;
	tmp = ((int2*) buf)[0];
	((int2*)buf)[0] = ((int2*) buf)[1];
	((int2*) buf)[1] = tmp;
	byte_swap(buf + 2, 2);
	/* falling through */
    }
    case 2: {
	char tmp;
	tmp = buf[0];
	buf[0] = buf[1];
	buf[1] = tmp;
	break;
    }
    default:
	assert(0);
    }
}